

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O3

void __thiscall r_exec::CSTController::reduce(CSTController *this,View *input)

{
  mutex *__mutex;
  list<core::P<r_exec::Overlay>_> *this_00;
  atomic_int_fast64_t *paVar1;
  _Object *p_Var2;
  _func_int **pp_Var3;
  bool bVar4;
  short sVar5;
  int iVar6;
  Goal *this_01;
  _func_int **pp_Var7;
  _iterator _Var8;
  _Fact *f_ihlp;
  undefined4 extraout_var;
  uint64_t uVar9;
  HLPBindingMap *this_02;
  const_iterator o;
  CSTOverlay *offspring;
  const_iterator local_58;
  P<r_exec::Overlay> local_48;
  pthread_mutex_t *local_40;
  CSTOverlay *local_38;
  
  bVar4 = HLPController::is_orphan(&this->super_HLPController);
  if ((!bVar4) &&
     (iVar6 = (*((input->super_View).object.object)->_vptr__Object[0xe])(), (char)iVar6 == '\0')) {
    this_01 = _Fact::get_goal((_Fact *)(input->super_View).object.object);
    if ((this_01 == (Goal *)0x0) ||
       ((bVar4 = Goal::is_self_goal(this_01), !bVar4 || (bVar4 = Goal::is_drive(this_01), bVar4))))
    {
      local_58 = (const_iterator)ZEXT816(0xffffffffffffffff);
      __mutex = &(this->super_HLPController).super_OController.super_Controller.m_reductionMutex;
      iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar6 != 0) {
        std::__throw_system_error(iVar6);
      }
      local_40 = (pthread_mutex_t *)__mutex;
      pp_Var7 = (_func_int **)(*Now)();
      this_00 = &(this->super_HLPController).super_OController.overlays;
      local_58.super__iterator._cell =
           (this->super_HLPController).super_OController.overlays.used_cells_head;
      local_58._list = this_00;
      bVar4 = false;
      _Var8._cell = local_58.super__iterator._cell;
      while (_Var8._cell != -1) {
        p_Var2 = ((local_58._list)->cells).
                 super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                 ._M_impl.super__Vector_impl_data._M_start[_Var8._cell].data.object;
        pp_Var3 = p_Var2[0xb]._vptr__Object;
        if ((pp_Var3 == (_func_int **)0x0) || (pp_Var7 <= pp_Var3)) {
          iVar6 = (*p_Var2->_vptr__Object[4])();
          if ((char)iVar6 != '\0') {
            local_58 = r_code::list<core::P<r_exec::Overlay>_>::erase(this_00,&local_58);
            goto LAB_0016217b;
          }
          bVar4 = CSTOverlay::reduce((CSTOverlay *)
                                     ((local_58._list)->cells).
                                     super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                                     ._M_impl.super__Vector_impl_data._M_start
                                     [local_58.super__iterator._cell].data.object,input,&local_38);
          if (local_38 == (CSTOverlay *)0x0) {
            if (bVar4) {
              local_58 = r_code::list<core::P<r_exec::Overlay>_>::erase(this_00,&local_58);
              _Var8 = local_58.super__iterator._cell;
              bVar4 = true;
            }
            else {
              _Var8._cell = ((local_58._list)->cells).
                            super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [local_58.super__iterator._cell].next;
              local_58.super__iterator._cell = _Var8._cell;
              bVar4 = false;
            }
          }
          else {
            local_48.object = (_Object *)local_38;
            LOCK();
            paVar1 = &(local_38->super_HLPOverlay).super_Overlay.super__Object.refCount;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
            UNLOCK();
            r_code::list<core::P<r_exec::Overlay>_>::push_front(this_00,&local_48);
            if ((CSTOverlay *)local_48.object != (CSTOverlay *)0x0) {
              LOCK();
              ((local_48.object)->refCount).super___atomic_base<long>._M_i =
                   ((local_48.object)->refCount).super___atomic_base<long>._M_i + -1;
              UNLOCK();
              if (((local_48.object)->refCount).super___atomic_base<long>._M_i < 1) {
                (*(((HLPOverlay *)&(local_48.object)->_vptr__Object)->super_Overlay).super__Object.
                  _vptr__Object[1])();
              }
            }
            _Var8._cell = local_58.super__iterator._cell;
          }
        }
        else {
          local_58 = r_code::list<core::P<r_exec::Overlay>_>::erase(this_00,&local_58);
LAB_0016217b:
          _Var8._cell = local_58.super__iterator._cell._cell;
        }
      }
      (*(this->super_HLPController).super_OController.super_Controller.super__Object._vptr__Object
        [8])(this,(ulong)bVar4);
      pthread_mutex_unlock(local_40);
    }
    else {
      f_ihlp = Goal::get_target(this_01);
      (*(f_ihlp->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[4])(f_ihlp,0);
      sVar5 = r_code::Atom::asOpcode();
      if (((sVar5 == Opcodes::ICst) &&
          (iVar6 = (*(f_ihlp->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                     super_LObject.super_Code.super__Object._vptr__Object[9])(f_ihlp,0),
          (_Object *)CONCAT44(extraout_var,iVar6) ==
          (((this->super_HLPController).super_OController.super_Controller.view)->object).object))
         && (uVar9 = HLPController::get_requirement_count(&this->super_HLPController), uVar9 == 0))
      {
        this_02 = (HLPBindingMap *)operator_new(0x40);
        HLPBindingMap::HLPBindingMap(this_02);
        LOCK();
        paVar1 = &(this_02->super_BindingMap).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
        HLPBindingMap::init_from_f_ihlp(this_02,f_ihlp);
        bVar4 = HLPController::evaluate_bwd_guards(&this->super_HLPController,this_02);
        if (bVar4) {
          abduce(this,this_02,(Fact *)(input->super_View).object.object);
        }
        LOCK();
        paVar1 = &(this_02->super_BindingMap).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((this_02->super_BindingMap).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
          (*(this_02->super_BindingMap).super__Object._vptr__Object[1])(this_02);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void CSTController::reduce(r_exec::View *input)
{
    if (is_orphan()) {
        return;
    }

    if (input->object->is_invalidated()) {
        return;
    }

    Goal *goal = ((_Fact *)input->object)->get_goal();

    if (goal && goal->is_self_goal() && !goal->is_drive()) { // goal is g->f->target.
        _Fact *goal_target = goal->get_target(); // handle only icst.

        if (goal_target->code(0).asOpcode() == Opcodes::ICst && goal_target->get_reference(0) == getObject()) { // f is f->icst; produce as many sub-goals as there are patterns in the cst.
            if (!get_requirement_count()) { // models will attempt to produce the icst
                P<HLPBindingMap> bm = new HLPBindingMap;
                bm->init_from_f_ihlp(goal_target);

                if (evaluate_bwd_guards(bm)) { // leaves the controller constant: no need to protect; bm may be updated.
                    abduce(bm, input->object);
                }
            }
        }
    } else {
        // std::cout<<"CTRL: "<<get_host()->get_oid()<<" > "<<input->object->get_oid()<<std::endl;
        bool match = false;
        CSTOverlay *offspring;
        r_code::list<P<Overlay> >::const_iterator o;
        std::lock_guard<std::mutex> guard(m_reductionMutex);
        uint64_t now = Now();

        for (o = overlays.begin(); o != overlays.end();) {
            if (!((CSTOverlay *)*o)->can_match(now)) {
                o = overlays.erase(o);
            } else if ((*o)->is_invalidated()) {
                o = overlays.erase(o);
            } else {
                match = ((CSTOverlay *)*o)->reduce(input, offspring);

                if (offspring) {
                    overlays.push_front(offspring);
                } else if (match) { // full match: no offspring.
                    o = overlays.erase(o);
                } else {
                    ++o;
                }
            }
        }

        check_last_match_time(match);
    }
}